

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_dc_predictor_16x8_c(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [13];
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  int iVar15;
  long lVar16;
  undefined1 uVar17;
  undefined4 uVar18;
  undefined1 auVar19 [16];
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  
  lVar16 = 0;
  iVar20 = 0;
  iVar21 = 0;
  iVar22 = 0;
  iVar23 = 0;
  do {
    uVar18 = *(undefined4 *)(above + lVar16);
    uVar10 = (ulong)(ushort)uVar18 & 0xffffffffffff00ff;
    auVar1._8_4_ = 0;
    auVar1._0_8_ = uVar10;
    auVar1[0xc] = (char)((uint)uVar18 >> 0x18);
    auVar2[8] = (char)((uint)uVar18 >> 0x10);
    auVar2._0_8_ = uVar10;
    auVar2[9] = 0;
    auVar2._10_3_ = auVar1._10_3_;
    auVar12._5_8_ = 0;
    auVar12._0_5_ = auVar2._8_5_;
    auVar3[4] = (char)((uint)uVar18 >> 8);
    auVar3._0_4_ = (int)uVar10;
    auVar3[5] = 0;
    auVar3._6_7_ = SUB137(auVar12 << 0x40,6);
    iVar20 = iVar20 + (int)uVar10;
    iVar21 = iVar21 + auVar3._4_4_;
    iVar22 = iVar22 + auVar2._8_4_;
    iVar23 = iVar23 + (uint)(uint3)(auVar1._10_3_ >> 0x10);
    lVar16 = lVar16 + 4;
  } while (lVar16 != 0x10);
  uVar18 = *(undefined4 *)left;
  uVar10 = (ulong)(ushort)uVar18 & 0xffffffffffff00ff;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar10;
  auVar4[0xc] = (char)((uint)uVar18 >> 0x18);
  auVar5[8] = (char)((uint)uVar18 >> 0x10);
  auVar5._0_8_ = uVar10;
  auVar5[9] = 0;
  auVar5._10_3_ = auVar4._10_3_;
  auVar13._5_8_ = 0;
  auVar13._0_5_ = auVar5._8_5_;
  auVar6[4] = (char)((uint)uVar18 >> 8);
  auVar6._0_4_ = (int)uVar10;
  auVar6[5] = 0;
  auVar6._6_7_ = SUB137(auVar13 << 0x40,6);
  uVar18 = *(undefined4 *)(left + 4);
  uVar11 = (ulong)(ushort)uVar18 & 0xffffffffffff00ff;
  auVar7._8_4_ = 0;
  auVar7._0_8_ = uVar11;
  auVar7[0xc] = (char)((uint)uVar18 >> 0x18);
  auVar8[8] = (char)((uint)uVar18 >> 0x10);
  auVar8._0_8_ = uVar11;
  auVar8[9] = 0;
  auVar8._10_3_ = auVar7._10_3_;
  auVar14._5_8_ = 0;
  auVar14._0_5_ = auVar8._8_5_;
  auVar9[4] = (char)((uint)uVar18 >> 8);
  auVar9._0_4_ = (int)uVar11;
  auVar9[5] = 0;
  auVar9._6_7_ = SUB137(auVar14 << 0x40,6);
  iVar15 = 8;
  uVar17 = (undefined1)
           (((uint)(uint3)(auVar7._10_3_ >> 0x10) + (uint)(uint3)(auVar4._10_3_ >> 0x10) +
             auVar9._4_4_ + auVar6._4_4_ +
             auVar8._8_4_ + auVar5._8_4_ +
             (int)uVar11 + (int)uVar10 + iVar23 + iVar21 + iVar22 + iVar20 + 0xc >> 3) * 0x5556 >>
           0x10);
  auVar19 = ZEXT216(CONCAT11(uVar17,uVar17));
  auVar19 = pshuflw(auVar19,auVar19,0);
  uVar18 = auVar19._0_4_;
  do {
    *(undefined4 *)dst = uVar18;
    *(undefined4 *)(dst + 4) = uVar18;
    *(undefined4 *)(dst + 8) = uVar18;
    *(undefined4 *)(dst + 0xc) = uVar18;
    dst = dst + stride;
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  return;
}

Assistant:

void aom_dc_predictor_16x8_c(uint8_t *dst, ptrdiff_t stride,
                             const uint8_t *above, const uint8_t *left) {
  dc_predictor_rect(dst, stride, 16, 8, above, left, 3, DC_MULTIPLIER_1X2);
}